

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void psignb_(PDISASM pMyDisasm)

{
  _Bool _Var1;
  
  if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      if ((pMyDisasm->Prefix).OperandSize == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
        (pMyDisasm->Prefix).OperandSize = '\b';
        (pMyDisasm->Instruction).Category = 0x70020;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"psignb",7);
        (pMyDisasm->Reserved_).MemDecoration = 0x6d;
        (pMyDisasm->Reserved_).Register_ = 4;
      }
      else {
        _Var1 = prefixes_present(pMyDisasm);
        if (_Var1) goto LAB_00122daf;
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        (pMyDisasm->Instruction).Category = 0x70020;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"psignb",7);
        (pMyDisasm->Reserved_).Register_ = 2;
      }
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpsignb",8);
      ArgsVEX(pMyDisasm);
      return;
    }
  }
LAB_00122daf:
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ psignb_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  } else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpsignb");
      #endif
      ArgsVEX(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }

  }
   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    GV.OperandSize = GV.OriginalOperandSize;
    pMyDisasm->Prefix.OperandSize = MandatoryPrefix;

    pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION+PACKED_SIGN;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psignb");
    #endif
    GV.MemDecoration = Arg2_m128_xmm;
    GV.Register_ = SSE_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
  else {
    if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
    GV.MemDecoration = Arg2qword;
    pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION+PACKED_SIGN;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "psignb");
    #endif
    GV.Register_ = MMX_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
}